

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZStack<int,_10>,_10>::TPZManVector
          (TPZManVector<TPZStack<int,_10>,_10> *this,int64_t size,TPZStack<int,_10> *copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int64_t *piVar3;
  int64_t iVar4;
  long lVar5;
  TPZStack<int,_10> *pTVar6;
  ulong uVar7;
  TPZStack<int,_10> *pTVar8;
  bool bVar9;
  
  lVar5 = 0;
  TPZVec<TPZStack<int,_10>_>::TPZVec(&this->super_TPZVec<TPZStack<int,_10>_>,0);
  (this->super_TPZVec<TPZStack<int,_10>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_016f2f38;
  pTVar8 = this->fExtAlloc;
  pTVar6 = pTVar8;
  do {
    TPZStack<int,_10>::TPZStack(pTVar6);
    lVar5 = lVar5 + -0x48;
    pTVar6 = pTVar6 + 1;
  } while (lVar5 != -0x2d0);
  if (size < 0xb) {
    iVar4 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size;
    uVar2 = SUB168(auVar1 * ZEXT816(0x48),0);
    uVar7 = uVar2 + 8;
    if (0xfffffffffffffff7 < uVar2) {
      uVar7 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x48),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    piVar3 = (int64_t *)operator_new__(uVar7);
    *piVar3 = size;
    pTVar8 = (TPZStack<int,_10> *)(piVar3 + 1);
    lVar5 = 0;
    pTVar6 = pTVar8;
    do {
      TPZStack<int,_10>::TPZStack(pTVar6);
      lVar5 = lVar5 + -0x48;
      pTVar6 = pTVar6 + 1;
      iVar4 = size;
    } while (size * -0x48 - lVar5 != 0);
  }
  (this->super_TPZVec<TPZStack<int,_10>_>).fStore = pTVar8;
  (this->super_TPZVec<TPZStack<int,_10>_>).fNElements = size;
  (this->super_TPZVec<TPZStack<int,_10>_>).fNAlloc = iVar4;
  lVar5 = 0;
  if (size < 1) {
    size = lVar5;
  }
  while (bVar9 = size != 0, size = size + -1, bVar9) {
    TPZManVector<int,_10>::operator=
              ((TPZManVector<int,_10> *)
               ((long)(((this->super_TPZVec<TPZStack<int,_10>_>).fStore)->
                      super_TPZManVector<int,_10>).fExtAlloc + lVar5 + -0x20),
               &copy->super_TPZManVector<int,_10>);
    lVar5 = lVar5 + 0x48;
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size, const T& copy) :
TPZVec<T>(0)
//fNExtAlloc( NumExtAlloc ) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy;
    }
}